

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O3

char * Mio_LibraryCleanStr(char *p)

{
  int iVar1;
  char cVar2;
  size_t sVar3;
  byte *__dest;
  byte *pbVar4;
  char cVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  
  iVar10 = 0;
  if (p == (char *)0x0) {
    __dest = (byte *)0x0;
  }
  else {
    sVar3 = strlen(p);
    __dest = (byte *)malloc(sVar3 + 1);
    strcpy((char *)__dest,p);
  }
  iVar8 = 0;
  cVar5 = '\0';
  pbVar4 = __dest;
  do {
    bVar6 = *pbVar4;
    uVar7 = (ulong)bVar6;
    iVar1 = 0;
    cVar2 = '\0';
    if (uVar7 < 0x2c) {
      if ((0xfc200000000U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_00406603;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0) {
          __dest[iVar10] = 0;
          return (char *)__dest;
        }
        goto LAB_0040662d;
      }
      bVar11 = iVar8 != 0;
      iVar8 = (uint)bVar11 * 2;
      cVar5 = bVar11 * '\x02';
    }
    else {
LAB_0040662d:
      if (((bVar6 != 0x5e) && (iVar1 = 0, cVar2 = '\0', bVar6 != 0x7c)) &&
         (iVar1 = 1, cVar2 = '\x01', cVar5 == '\x02')) {
        lVar9 = (long)iVar10;
        iVar10 = iVar10 + 1;
        __dest[lVar9] = 0x20;
        bVar6 = *pbVar4;
      }
LAB_00406603:
      cVar5 = cVar2;
      iVar8 = iVar1;
      lVar9 = (long)iVar10;
      iVar10 = iVar10 + 1;
      __dest[lVar9] = bVar6;
    }
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

char * Mio_LibraryCleanStr( char * p )
{
    int i, k;
    int whitespace_state = 0;
    char * pRes = Abc_UtilStrsav( p );
    for ( i = k = 0; pRes[i]; i++ )
        if ( pRes[i] != ' ' && pRes[i] != '\t' && pRes[i] != '\r' && pRes[i] != '\n' ) 
        {
            if ( pRes[i] != '(' && pRes[i] != ')' && pRes[i] != '+' && pRes[i] != '*' && pRes[i] != '|' && pRes[i] != '&' && pRes[i] != '^' && pRes[i] != '\'' && pRes[i] != '!' ) 
            {
                if (whitespace_state == 2)
                    pRes[k++] = ' ';
                whitespace_state = 1;
            } 
            else
                whitespace_state = 0;
            pRes[k++] = pRes[i];
        } 
        else
            whitespace_state = whitespace_state ? 2 : 0;
    pRes[k] = 0;
    return pRes;
}